

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

void free_ZNode(Parser *p,ZNode *z,SNode *s)

{
  uint32 *puVar1;
  PNode *pn;
  SNode *s_00;
  SNode **__ptr;
  uint uVar2;
  ulong uVar3;
  
  pn = z->pn;
  puVar1 = &pn->refcount;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 == 0) {
    free_PNode(p,pn);
  }
  uVar2 = (z->sns).n;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      s_00 = (z->sns).v[uVar3];
      if (s_00 != s) {
        puVar1 = &s_00->refcount;
        *puVar1 = *puVar1 - 1;
        if (*puVar1 == 0) {
          free_SNode(p,s_00);
          uVar2 = (z->sns).n;
        }
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar2);
  }
  __ptr = (z->sns).v;
  if (__ptr != (z->sns).e && __ptr != (SNode **)0x0) {
    free(__ptr);
  }
  free(z);
  return;
}

Assistant:

static void free_ZNode(Parser *p, ZNode *z, SNode *s) {
  uint i;
  unref_pn(p, z->pn);
  for (i = 0; i < z->sns.n; i++)
    if (s != z->sns.v[i]) unref_sn(p, z->sns.v[i]);
  vec_free(&z->sns);
#ifdef USE_FREELISTS
  znode_next(z) = p->free_znodes;
  p->free_znodes = z;
#else
  FREE(z);
#endif
}